

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffcrtb(fitsfile *fptr,int tbltype,LONGLONG naxis2,int tfields,char **ttype,char **tform,
          char **tunit,char *extnm,int *status)

{
  int *unaff_RBX;
  int in_ESI;
  int *in_RDI;
  int unaff_retaddr;
  fitsfile *in_stack_00000008;
  int *in_stack_00000018;
  long *tbcol;
  LONGLONG naxis1;
  long *in_stack_000000c0;
  char **in_stack_000000c8;
  int in_stack_000000d4;
  LONGLONG in_stack_000000d8;
  LONGLONG in_stack_000000e0;
  fitsfile *in_stack_000000e8;
  char **in_stack_00000100;
  char **in_stack_00000108;
  char *in_stack_00000110;
  int *in_stack_00000118;
  char **in_stack_00000130;
  char **in_stack_00000138;
  char **in_stack_00000140;
  int in_stack_0000014c;
  LONGLONG in_stack_00000150;
  fitsfile *in_stack_00000158;
  char *in_stack_00000170;
  LONGLONG in_stack_00000178;
  int *in_stack_00000180;
  int *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  undefined8 uVar1;
  fitsfile *fptr_00;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  fptr_00 = (fitsfile *)0x0;
  uVar1 = 0;
  if (*in_stack_00000018 < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_00000008,unaff_retaddr,unaff_RBX,
             (int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x70) !=
        *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) {
      ffcrhd(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x54) == 0) {
      ffcrim(fptr_00,(int)((ulong)uVar1 >> 0x20),(int)uVar1,(long *)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
      ffcrhd(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    if (in_ESI == 2) {
      ffphbn(in_stack_00000158,in_stack_00000150,in_stack_0000014c,in_stack_00000140,
             in_stack_00000138,in_stack_00000130,in_stack_00000170,in_stack_00000178,
             in_stack_00000180);
    }
    else if (in_ESI == 1) {
      ffphtb(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
             in_stack_000000c8,in_stack_000000c0,in_stack_00000100,in_stack_00000108,
             in_stack_00000110,in_stack_00000118);
    }
    else {
      *in_stack_00000018 = 0xeb;
    }
    iVar2 = *in_stack_00000018;
  }
  else {
    iVar2 = *in_stack_00000018;
  }
  return iVar2;
}

Assistant:

int ffcrtb(fitsfile *fptr,  /* I - FITS file pointer                        */
           int tbltype,     /* I - type of table to create                  */
           LONGLONG naxis2, /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnm, /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Create a table extension in a FITS file. 
*/
{
    LONGLONG naxis1 = 0;
    long *tbcol = 0;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* create new extension if current header is not empty */
    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        ffcrhd(fptr, status);

    if ((fptr->Fptr)->curhdu == 0)  /* have to create dummy primary array */
    {
       ffcrim(fptr, 16, 0, tbcol, status);
       ffcrhd(fptr, status);
    }
    
    if (tbltype == BINARY_TBL)
    {
      /* write the required header keywords. This will write PCOUNT = 0 */
      ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, 0, status);
    }
    else if (tbltype == ASCII_TBL)
    {
      /* write the required header keywords */
      /* default values for naxis1 and tbcol will be calculated */
      ffphtb(fptr, naxis1, naxis2, tfields, ttype, tbcol, tform, tunit,
             extnm, status);
    }
    else
      *status = NOT_TABLE;

    return(*status);
}